

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_stdout_and_stderr_to_file_swap(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  uint file;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  uv_process_options_t *puVar7;
  int extraout_EDX;
  char *loop;
  uv__queue *unaff_RBP;
  int iVar8;
  undefined1 *puVar9;
  uv_handle_t *puVar10;
  uv_process_options_t *unaff_R14;
  char *req;
  uv__queue *unaff_R15;
  int64_t eval_b_4;
  int64_t eval_b_8;
  int64_t eval_b;
  uv_stdio_container_t stdio [3];
  uv_fs_t fs_req;
  undefined1 auStackY_890 [48];
  uv_loop_t *puStackY_860;
  long lStackY_850;
  long lStackY_848;
  uv_loop_t *puStackY_840;
  uv_process_options_t *puStackY_838;
  long lStackY_828;
  long lStackY_820;
  uv_os_fd_t uStackY_814;
  uv_stdio_container_t uStackY_810;
  undefined4 uStackY_800;
  undefined4 uStackY_7f8;
  undefined4 uStackY_7f0;
  undefined4 uStackY_7e8;
  undefined4 uStackY_7e0;
  uv_os_fd_t uStackY_7d8;
  sockaddr_in sStackY_7d0;
  uv_loop_t *puStackY_7c0;
  undefined8 uStackY_7b8;
  long lStackY_7b0;
  uv_tcp_t uStackY_7a8;
  long lStackY_6d0;
  long lStackY_6c8;
  uv_stdio_container_t uStackY_6c0;
  undefined4 uStackY_6b0;
  undefined4 uStackY_6a0;
  undefined4 uStackY_690;
  uv_loop_t *puStackY_688;
  undefined1 auStackY_678 [296];
  undefined1 auStackY_550 [16];
  char acStackY_540 [32];
  uv_stdio_container_t uStackY_520;
  undefined4 uStackY_510;
  uv_loop_t *puStackY_508;
  uv_write_t uStackY_4f8;
  uv_stream_t uStackY_430;
  uv_stream_t uStackY_348;
  uv_loop_t *puStackY_260;
  uv_fs_t *puStackY_258;
  uv__queue *puStackY_250;
  uv_buf_t local_228;
  uv_rwlock_t local_218;
  uv_fs_t local_1e0;
  
  local_228.len = (size_t)local_228.base;
  loop = "stdout_file";
  puStackY_250 = (uv__queue *)0x1bc1f7;
  unlink("stdout_file");
  puStackY_250 = (uv__queue *)0x1bc203;
  unlink("stderr_file");
  puStackY_250 = (uv__queue *)0x1bc216;
  init_process_options("spawn_helper6",exit_cb);
  puStackY_250 = (uv__queue *)0x1bc233;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,&local_1e0,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar4 = (uint)local_1e0.result;
  local_218.__align = (long)iVar3;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_228.len;
  local_228 = (uv_buf_t)(auVar2 << 0x40);
  if (local_218.__align == 0) {
    loop = (char *)(ulong)(uint)local_1e0.result;
    puStackY_250 = (uv__queue *)0x1bc260;
    uv_fs_req_cleanup(&local_1e0);
    puStackY_250 = (uv__queue *)0x1bc26c;
    uVar4 = dup2(uVar4,1);
    unaff_RBP = (uv__queue *)(ulong)uVar4;
    local_218.__align = (long)(int)uVar4;
    local_228.base = (char *)0xffffffffffffffff;
    if (local_218.__align == -1) goto LAB_001bc63f;
    puStackY_250 = (uv__queue *)0x1bc2af;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,&local_1e0,"stderr_file",0x42,0x180,(uv_fs_cb)0x0);
    local_218.__align = (long)iVar3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_228.len;
    local_228 = (uv_buf_t)(auVar1 << 0x40);
    if (local_218.__align != 0) goto LAB_001bc64e;
    puStackY_250 = (uv__queue *)0x1bc2dc;
    uv_fs_req_cleanup(&local_1e0);
    unaff_R15 = (uv__queue *)0x2;
    puStackY_250 = (uv__queue *)0x1bc2ee;
    file = dup2((uint)local_1e0.result,2);
    loop = (char *)(ulong)file;
    local_218.__align = (long)(int)file;
    local_228.base = (char *)0xffffffffffffffff;
    if (local_218.__align == -1) goto LAB_001bc65d;
    options.stdio = (uv_stdio_container_t *)&local_218;
    unaff_R14 = &options;
    local_218.__data.__writers = (int)file >> 0x1f;
    local_218.__align = (ulong)local_218.__data.__writers << 0x20;
    local_218.__data.__pad3 = 2;
    local_218._32_4_ = 2;
    options.stdio_count = 3;
    puStackY_250 = (uv__queue *)0x1bc346;
    local_218.__data.__cur_writer = file;
    local_218.__data.__pad2._0_4_ = uVar4;
    puVar5 = uv_default_loop();
    puStackY_250 = (uv__queue *)0x1bc358;
    iVar3 = uv_spawn(puVar5,&process,&options);
    local_228.base = (char *)(long)iVar3;
    if ((char *)(long)iVar3 != (char *)0x0) goto LAB_001bc66c;
    puStackY_250 = (uv__queue *)0x1bc37d;
    puVar5 = uv_default_loop();
    puStackY_250 = (uv__queue *)0x1bc387;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    local_228.base = (char *)(long)iVar3;
    if ((char *)(long)iVar3 != (char *)0x0) goto LAB_001bc67b;
    local_228.base = (char *)0x1;
    if (exit_cb_called != 1) goto LAB_001bc68a;
    local_228.base = (char *)0x1;
    if (close_cb_called != 1) goto LAB_001bc699;
    puStackY_250 = (uv__queue *)0x1bc402;
    local_228 = uv_buf_init(output,0x400);
    puStackY_250 = (uv__queue *)0x1bc42d;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&local_1e0,uVar4,&local_228,1,0,(uv_fs_cb)0x0);
    req = (char *)unaff_R14;
    if (iVar3 < 0xf) goto LAB_001bc6a8;
    req = (char *)&local_1e0;
    puStackY_250 = (uv__queue *)0x1bc45a;
    uv_fs_req_cleanup((uv_fs_t *)req);
    puStackY_250 = (uv__queue *)0x1bc468;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)req,uVar4,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_001bc6b7;
    puStackY_250 = (uv__queue *)0x1bc492;
    uv_fs_req_cleanup(&local_1e0);
    req = output;
    puStackY_250 = (uv__queue *)0x1bc4aa;
    printf("output is: %s",output);
    puStackY_250 = (uv__queue *)0x1bc4be;
    iVar3 = strncmp("hello errworld\n",output,0xf);
    if (iVar3 != 0) goto LAB_001bc6c6;
    puStackY_250 = (uv__queue *)0x1bc502;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&local_1e0,file,&local_228,1,0,(uv_fs_cb)0x0);
    if (iVar3 < 0xc) goto LAB_001bc6d5;
    req = (char *)&local_1e0;
    puStackY_250 = (uv__queue *)0x1bc52f;
    uv_fs_req_cleanup((uv_fs_t *)req);
    puStackY_250 = (uv__queue *)0x1bc53d;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)req,file,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_001bc6e4;
    puStackY_250 = (uv__queue *)0x1bc567;
    uv_fs_req_cleanup(&local_1e0);
    loop = output;
    puStackY_250 = (uv__queue *)0x1bc57f;
    printf("output is: %s",output);
    puStackY_250 = (uv__queue *)0x1bc593;
    iVar3 = strncmp("hello world\n",output,0xc);
    if (iVar3 != 0) goto LAB_001bc6f3;
    puStackY_250 = (uv__queue *)0x1bc5bf;
    unlink("stdout_file");
    puStackY_250 = (uv__queue *)0x1bc5cb;
    unlink("stderr_file");
    puStackY_250 = (uv__queue *)0x1bc5d0;
    loop = (char *)uv_default_loop();
    puStackY_250 = (uv__queue *)0x1bc5e4;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStackY_250 = (uv__queue *)0x1bc5ee;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puStackY_250 = (uv__queue *)0x1bc5fc;
    puVar5 = uv_default_loop();
    puStackY_250 = (uv__queue *)0x1bc604;
    iVar3 = uv_loop_close(puVar5);
    if (iVar3 == 0) {
      puStackY_250 = (uv__queue *)0x1bc620;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStackY_250 = (uv__queue *)0x1bc63f;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_1();
LAB_001bc63f:
    puStackY_250 = (uv__queue *)0x1bc64e;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_15();
LAB_001bc64e:
    puStackY_250 = (uv__queue *)0x1bc65d;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_2();
LAB_001bc65d:
    puStackY_250 = (uv__queue *)0x1bc66c;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_14();
LAB_001bc66c:
    puStackY_250 = (uv__queue *)0x1bc67b;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_3();
LAB_001bc67b:
    puStackY_250 = (uv__queue *)0x1bc68a;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_4();
LAB_001bc68a:
    puStackY_250 = (uv__queue *)0x1bc699;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_5();
LAB_001bc699:
    puStackY_250 = (uv__queue *)0x1bc6a8;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_6();
    req = (char *)unaff_R14;
LAB_001bc6a8:
    puStackY_250 = (uv__queue *)0x1bc6b7;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_13();
LAB_001bc6b7:
    puStackY_250 = (uv__queue *)0x1bc6c6;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_7();
LAB_001bc6c6:
    puStackY_250 = (uv__queue *)0x1bc6d5;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_8();
LAB_001bc6d5:
    puStackY_250 = (uv__queue *)0x1bc6e4;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_12();
LAB_001bc6e4:
    puStackY_250 = (uv__queue *)0x1bc6f3;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_9();
LAB_001bc6f3:
    puStackY_250 = (uv__queue *)0x1bc702;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_10();
  }
  puStackY_250 = (uv__queue *)run_test_spawn_stdin;
  run_test_spawn_stdout_and_stderr_to_file_swap_cold_11();
  iVar8 = (int)auStackY_678 + 0x118;
  builtin_strncpy(acStackY_540,"hello-from-spawn_stdin",0x17);
  auStackY_678._272_8_ = (uv_async_cb)0x1bc74b;
  puStackY_260 = (uv_loop_t *)loop;
  puStackY_258 = (uv_fs_t *)req;
  puStackY_250 = unaff_R15;
  init_process_options("spawn_helper3",exit_cb);
  auStackY_678._272_8_ = (uv_async_cb)0x1bc750;
  puVar6 = uv_default_loop();
  puVar5 = (uv_loop_t *)&uStackY_348;
  auStackY_678._272_8_ = (uv_async_cb)0x1bc765;
  uv_pipe_init(puVar6,(uv_pipe_t *)puVar5,0);
  auStackY_678._272_8_ = (uv_async_cb)0x1bc76a;
  puVar6 = uv_default_loop();
  auStackY_678._272_8_ = (uv_async_cb)0x1bc77f;
  uv_pipe_init(puVar6,(uv_pipe_t *)&uStackY_430,0);
  options.stdio = &uStackY_520;
  uStackY_520.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  uStackY_510 = 0x21;
  options.stdio_count = 2;
  auStackY_678._272_8_ = (uv_async_cb)0x1bc7b6;
  uStackY_520.data.stream = &uStackY_430;
  puStackY_508 = puVar5;
  puVar6 = uv_default_loop();
  auStackY_678._272_8_ = (uv_async_cb)0x1bc7c8;
  iVar3 = uv_spawn(puVar6,&process,&options);
  uStackY_4f8.data = (void *)(long)iVar3;
  auStackY_550._0_8_ = (char *)0x0;
  if ((uv__queue *)uStackY_4f8.data == (uv__queue *)0x0) {
    auStackY_550._0_8_ = acStackY_540;
    auStackY_550._8_8_ = 0x17;
    auStackY_678._272_8_ = (uv_async_cb)0x1bc81b;
    iVar3 = uv_write(&uStackY_4f8,&uStackY_430,(uv_buf_t *)auStackY_550,1,write_cb);
    auStackY_678._288_8_ = SEXT48(iVar3);
    auStackY_678._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_678._288_8_ != (uv__queue *)0x0) goto LAB_001bc981;
    auStackY_678._272_8_ = (uv_async_cb)0x1bc854;
    iVar3 = uv_read_start(&uStackY_348,on_alloc,on_read);
    auStackY_678._288_8_ = SEXT48(iVar3);
    auStackY_678._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_678._288_8_ != (uv__queue *)0x0) goto LAB_001bc98e;
    auStackY_678._272_8_ = (uv_async_cb)0x1bc877;
    puVar6 = uv_default_loop();
    auStackY_678._272_8_ = (uv_async_cb)0x1bc881;
    iVar3 = uv_run(puVar6,UV_RUN_DEFAULT);
    auStackY_678._288_8_ = SEXT48(iVar3);
    auStackY_678._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_678._288_8_ != (uv__queue *)0x0) goto LAB_001bc99b;
    auStackY_678._288_8_ = (uv__queue *)0x1;
    auStackY_678._280_8_ = SEXT48(exit_cb_called);
    if ((uv__queue *)auStackY_678._280_8_ != (uv__queue *)0x1) goto LAB_001bc9a8;
    auStackY_678._288_8_ = (uv__queue *)0x3;
    auStackY_678._280_8_ = SEXT48(close_cb_called);
    if ((uv__queue *)auStackY_678._280_8_ != (uv__queue *)0x3) goto LAB_001bc9b5;
    auStackY_678._272_8_ = (uv_async_cb)0x1bc8f6;
    iVar3 = strcmp(acStackY_540,output);
    auStackY_678._288_8_ = SEXT48(iVar3);
    auStackY_678._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_678._288_8_ != (uv__queue *)0x0) goto LAB_001bc9c2;
    auStackY_678._272_8_ = (uv_async_cb)0x1bc919;
    puVar5 = uv_default_loop();
    auStackY_678._272_8_ = (uv_async_cb)0x1bc92d;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    auStackY_678._272_8_ = (uv_async_cb)0x1bc937;
    uv_run(puVar5,UV_RUN_DEFAULT);
    auStackY_678._288_8_ = (uv__queue *)0x0;
    auStackY_678._272_8_ = (uv_async_cb)0x1bc945;
    puVar6 = uv_default_loop();
    auStackY_678._272_8_ = (uv_async_cb)0x1bc94d;
    iVar3 = uv_loop_close(puVar6);
    auStackY_678._280_8_ = SEXT48(iVar3);
    if (auStackY_678._288_8_ == auStackY_678._280_8_) {
      auStackY_678._272_8_ = (uv_async_cb)0x1bc963;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStackY_678._272_8_ = (uv_async_cb)0x1bc981;
    run_test_spawn_stdin_cold_1();
LAB_001bc981:
    auStackY_678._272_8_ = (uv_async_cb)0x1bc98e;
    run_test_spawn_stdin_cold_2();
LAB_001bc98e:
    auStackY_678._272_8_ = (uv_async_cb)0x1bc99b;
    run_test_spawn_stdin_cold_3();
LAB_001bc99b:
    auStackY_678._272_8_ = (uv_async_cb)0x1bc9a8;
    run_test_spawn_stdin_cold_4();
LAB_001bc9a8:
    auStackY_678._272_8_ = (uv_async_cb)0x1bc9b5;
    run_test_spawn_stdin_cold_5();
LAB_001bc9b5:
    auStackY_678._272_8_ = (uv_async_cb)0x1bc9c2;
    run_test_spawn_stdin_cold_6();
LAB_001bc9c2:
    auStackY_678._272_8_ = (uv_async_cb)0x1bc9cf;
    run_test_spawn_stdin_cold_7();
  }
  puVar9 = auStackY_678 + 0x120;
  auStackY_678._272_8_ = write_cb;
  run_test_spawn_stdin_cold_8();
  auStackY_678._272_8_ = SEXT48(iVar8);
  auStackY_678._264_8_ = 0;
  if ((uv_async_cb)auStackY_678._272_8_ == (uv_async_cb)0x0) {
    uv_close(*(uv_handle_t **)(puVar9 + 0x58),close_cb);
    return extraout_EAX;
  }
  auStackY_678._248_8_ = run_test_spawn_stdio_greater_than_3;
  write_cb_cold_1();
  uStackY_7a8.queued_fds = (void *)0x1bca3e;
  auStackY_678._232_8_ = puVar5;
  auStackY_678._240_8_ = &uStackY_430;
  auStackY_678._248_8_ = unaff_RBP;
  init_process_options("spawn_helper5",exit_cb);
  uStackY_7a8.queued_fds = (void *)0x1bca43;
  puVar5 = uv_default_loop();
  puVar7 = (uv_process_options_t *)auStackY_678;
  uStackY_7a8.queued_fds = (void *)0x1bca57;
  uv_pipe_init(puVar5,(uv_pipe_t *)puVar7,0);
  options.stdio = &uStackY_6c0;
  uStackY_6c0.flags = UV_IGNORE;
  uStackY_6b0 = 0;
  uStackY_6a0 = 0;
  uStackY_690 = 0x21;
  options.stdio_count = 4;
  uStackY_7a8.queued_fds = (void *)0x1bca8c;
  puStackY_688 = (uv_loop_t *)puVar7;
  puVar5 = uv_default_loop();
  uStackY_7a8.queued_fds = (void *)0x1bca9e;
  iVar3 = uv_spawn(puVar5,&process,&options);
  lStackY_6c8 = (long)iVar3;
  lStackY_6d0 = 0;
  if (lStackY_6c8 == 0) {
    uStackY_7a8.queued_fds = (void *)0x1bcad4;
    iVar3 = uv_read_start((uv_stream_t *)auStackY_678,on_alloc,on_read);
    lStackY_6c8 = (long)iVar3;
    lStackY_6d0 = 0;
    if (lStackY_6c8 != 0) goto LAB_001bcc14;
    uStackY_7a8.queued_fds = (void *)0x1bcaf7;
    puVar5 = uv_default_loop();
    uStackY_7a8.queued_fds = (void *)0x1bcb01;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    lStackY_6c8 = (long)iVar3;
    lStackY_6d0 = 0;
    if (lStackY_6c8 != 0) goto LAB_001bcc21;
    lStackY_6c8 = 1;
    lStackY_6d0 = (long)exit_cb_called;
    if (lStackY_6d0 != 1) goto LAB_001bcc2e;
    lStackY_6c8 = 2;
    lStackY_6d0 = (long)close_cb_called;
    if (lStackY_6d0 != 2) goto LAB_001bcc3b;
    uStackY_7a8.queued_fds = (void *)0x1bcb7d;
    printf("output from stdio[3] is: %s",output);
    uStackY_7a8.queued_fds = (void *)0x1bcb8c;
    iVar3 = strcmp("fourth stdio!\n",output);
    lStackY_6c8 = (long)iVar3;
    lStackY_6d0 = 0;
    puVar7 = (uv_process_options_t *)output;
    if (lStackY_6c8 != 0) goto LAB_001bcc48;
    uStackY_7a8.queued_fds = (void *)0x1bcbaf;
    puVar7 = (uv_process_options_t *)uv_default_loop();
    uStackY_7a8.queued_fds = (void *)0x1bcbc3;
    uv_walk((uv_loop_t *)puVar7,close_walk_cb,(void *)0x0);
    uStackY_7a8.queued_fds = (void *)0x1bcbcd;
    uv_run((uv_loop_t *)puVar7,UV_RUN_DEFAULT);
    lStackY_6c8 = 0;
    uStackY_7a8.queued_fds = (void *)0x1bcbdb;
    puVar5 = uv_default_loop();
    uStackY_7a8.queued_fds = (void *)0x1bcbe3;
    iVar3 = uv_loop_close(puVar5);
    lStackY_6d0 = (long)iVar3;
    if (lStackY_6c8 == lStackY_6d0) {
      uStackY_7a8.queued_fds = (void *)0x1bcbf9;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStackY_7a8.queued_fds = (void *)0x1bcc14;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_001bcc14:
    uStackY_7a8.queued_fds = (void *)0x1bcc21;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_001bcc21:
    uStackY_7a8.queued_fds = (void *)0x1bcc2e;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_001bcc2e:
    uStackY_7a8.queued_fds = (void *)0x1bcc3b;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_001bcc3b:
    uStackY_7a8.queued_fds = (void *)0x1bcc48;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_001bcc48:
    uStackY_7a8.queued_fds = (void *)0x1bcc55;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  uStackY_7a8.queued_fds = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  puStackY_7c0 = (uv_loop_t *)0x1bcc6e;
  puVar5 = uv_default_loop();
  puStackY_7c0 = (uv_loop_t *)0x1bcc7b;
  iVar3 = uv_tcp_init(puVar5,&uStackY_7a8);
  lStackY_7b0 = (long)iVar3;
  uStackY_7b8 = 0;
  if (lStackY_7b0 == 0) {
    puStackY_7c0 = (uv_loop_t *)0x1bcca4;
    iVar3 = uv_tcp_open(&uStackY_7a8,3);
    lStackY_7b0 = (long)iVar3;
    uStackY_7b8 = 0;
    if (lStackY_7b0 != 0) goto LAB_001bcd03;
    puStackY_7c0 = (uv_loop_t *)0x1bcccf;
    iVar3 = uv_listen((uv_stream_t *)&uStackY_7a8,0x1000,(uv_connection_cb)0x0);
    lStackY_7b0 = (long)iVar3;
    uStackY_7b8 = 0;
    if (lStackY_7b0 == 0) {
      return 1;
    }
  }
  else {
    puStackY_7c0 = (uv_loop_t *)0x1bcd03;
    spawn_tcp_server_helper_cold_1();
LAB_001bcd03:
    puStackY_7c0 = (uv_loop_t *)0x1bcd10;
    spawn_tcp_server_helper_cold_2();
  }
  puStackY_7c0 = (uv_loop_t *)run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  puStackY_838 = (uv_process_options_t *)0x1bcd35;
  puStackY_7c0 = (uv_loop_t *)puVar7;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  puStackY_838 = (uv_process_options_t *)0x1bcd4b;
  iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,&sStackY_7d0);
  uStackY_810._0_8_ = SEXT48(iVar3);
  lStackY_828 = 0;
  if (uStackY_810._0_8_ == 0) {
    puStackY_838 = (uv_process_options_t *)0x1bcd70;
    puVar5 = uv_default_loop();
    puStackY_838 = (uv_process_options_t *)0x1bcd84;
    iVar3 = uv_tcp_init_ex(puVar5,&tcp_server,2);
    uStackY_810._0_8_ = SEXT48(iVar3);
    lStackY_828 = 0;
    if (uStackY_810._0_8_ != 0) goto LAB_001bcf69;
    puStackY_838 = (uv_process_options_t *)0x1bcdb7;
    iVar3 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStackY_7d0,0);
    uStackY_810._0_8_ = SEXT48(iVar3);
    lStackY_828 = 0;
    if (uStackY_810._0_8_ != 0) goto LAB_001bcf78;
    puStackY_838 = (uv_process_options_t *)0x1bcde8;
    iVar3 = uv_fileno((uv_handle_t *)&tcp_server,&uStackY_814);
    uStackY_810._0_8_ = SEXT48(iVar3);
    lStackY_828 = 0;
    if (uStackY_810._0_8_ != 0) goto LAB_001bcf87;
    options.stdio = &uStackY_810;
    puVar7 = &options;
    uStackY_810._4_4_ = iVar3 >> 0x1f;
    uStackY_810.flags = 2;
    uStackY_810.data.file = 0;
    uStackY_800 = 2;
    uStackY_7f8 = 1;
    uStackY_7f0 = 2;
    uStackY_7e8 = 2;
    uStackY_7e0 = 2;
    uStackY_7d8 = uStackY_814;
    options.stdio_count = 4;
    puStackY_838 = (uv_process_options_t *)0x1bce52;
    puVar5 = uv_default_loop();
    puStackY_838 = (uv_process_options_t *)0x1bce64;
    iVar3 = uv_spawn(puVar5,&process,&options);
    lStackY_828 = (long)iVar3;
    lStackY_820 = 0;
    if (lStackY_828 != 0) goto LAB_001bcf96;
    puStackY_838 = (uv_process_options_t *)0x1bce89;
    puVar5 = uv_default_loop();
    puStackY_838 = (uv_process_options_t *)0x1bce93;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    lStackY_828 = (long)iVar3;
    lStackY_820 = 0;
    if (lStackY_828 != 0) goto LAB_001bcfa5;
    lStackY_828 = 1;
    lStackY_820 = (long)exit_cb_called;
    if (lStackY_820 != 1) goto LAB_001bcfb4;
    lStackY_828 = 1;
    lStackY_820 = (long)close_cb_called;
    if (lStackY_820 != 1) goto LAB_001bcfc3;
    puStackY_838 = (uv_process_options_t *)0x1bcf02;
    puVar7 = (uv_process_options_t *)uv_default_loop();
    puStackY_838 = (uv_process_options_t *)0x1bcf16;
    uv_walk((uv_loop_t *)puVar7,close_walk_cb,(void *)0x0);
    puStackY_838 = (uv_process_options_t *)0x1bcf20;
    uv_run((uv_loop_t *)puVar7,UV_RUN_DEFAULT);
    lStackY_828 = 0;
    puStackY_838 = (uv_process_options_t *)0x1bcf2e;
    puVar5 = uv_default_loop();
    puStackY_838 = (uv_process_options_t *)0x1bcf36;
    iVar3 = uv_loop_close(puVar5);
    lStackY_820 = (long)iVar3;
    if (lStackY_828 == lStackY_820) {
      puStackY_838 = (uv_process_options_t *)0x1bcf52;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStackY_838 = (uv_process_options_t *)0x1bcf69;
    run_test_spawn_tcp_server_cold_1();
LAB_001bcf69:
    puStackY_838 = (uv_process_options_t *)0x1bcf78;
    run_test_spawn_tcp_server_cold_2();
LAB_001bcf78:
    puStackY_838 = (uv_process_options_t *)0x1bcf87;
    run_test_spawn_tcp_server_cold_3();
LAB_001bcf87:
    puStackY_838 = (uv_process_options_t *)0x1bcf96;
    run_test_spawn_tcp_server_cold_4();
LAB_001bcf96:
    puStackY_838 = (uv_process_options_t *)0x1bcfa5;
    run_test_spawn_tcp_server_cold_5();
LAB_001bcfa5:
    puStackY_838 = (uv_process_options_t *)0x1bcfb4;
    run_test_spawn_tcp_server_cold_6();
LAB_001bcfb4:
    puStackY_838 = (uv_process_options_t *)0x1bcfc3;
    run_test_spawn_tcp_server_cold_7();
LAB_001bcfc3:
    puStackY_838 = (uv_process_options_t *)0x1bcfd2;
    run_test_spawn_tcp_server_cold_8();
  }
  puStackY_838 = (uv_process_options_t *)run_test_spawn_ignored_stdio;
  run_test_spawn_tcp_server_cold_9();
  puStackY_838 = &options;
  puStackY_860 = (uv_loop_t *)0x1bcffb;
  puStackY_840 = (uv_loop_t *)puVar7;
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  puVar7 = &options;
  options.stdio_count = 0;
  puStackY_860 = (uv_loop_t *)0x1bd01b;
  puVar5 = uv_default_loop();
  puStackY_860 = (uv_loop_t *)0x1bd02d;
  iVar3 = uv_spawn(puVar5,&process,&options);
  lStackY_848 = (long)iVar3;
  lStackY_850 = 0;
  if (lStackY_848 == 0) {
    puStackY_860 = (uv_loop_t *)0x1bd04e;
    puVar5 = uv_default_loop();
    puStackY_860 = (uv_loop_t *)0x1bd058;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    lStackY_848 = (long)iVar3;
    lStackY_850 = 0;
    if (lStackY_848 != 0) goto LAB_001bd12c;
    lStackY_848 = 1;
    lStackY_850 = (long)exit_cb_called;
    if (lStackY_850 != 1) goto LAB_001bd13b;
    lStackY_848 = 1;
    lStackY_850 = (long)close_cb_called;
    if (lStackY_850 != 1) goto LAB_001bd14a;
    puStackY_860 = (uv_loop_t *)0x1bd0c7;
    puVar7 = (uv_process_options_t *)uv_default_loop();
    puStackY_860 = (uv_loop_t *)0x1bd0db;
    uv_walk((uv_loop_t *)puVar7,close_walk_cb,(void *)0x0);
    puStackY_860 = (uv_loop_t *)0x1bd0e5;
    uv_run((uv_loop_t *)puVar7,UV_RUN_DEFAULT);
    lStackY_848 = 0;
    puStackY_860 = (uv_loop_t *)0x1bd0f3;
    puVar5 = uv_default_loop();
    puStackY_860 = (uv_loop_t *)0x1bd0fb;
    iVar3 = uv_loop_close(puVar5);
    lStackY_850 = (long)iVar3;
    if (lStackY_848 == lStackY_850) {
      puStackY_860 = (uv_loop_t *)0x1bd113;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStackY_860 = (uv_loop_t *)0x1bd12c;
    run_test_spawn_ignored_stdio_cold_1();
LAB_001bd12c:
    puStackY_860 = (uv_loop_t *)0x1bd13b;
    run_test_spawn_ignored_stdio_cold_2();
LAB_001bd13b:
    puStackY_860 = (uv_loop_t *)0x1bd14a;
    run_test_spawn_ignored_stdio_cold_3();
LAB_001bd14a:
    puStackY_860 = (uv_loop_t *)0x1bd159;
    run_test_spawn_ignored_stdio_cold_4();
  }
  puStackY_860 = (uv_loop_t *)run_test_spawn_and_kill;
  run_test_spawn_ignored_stdio_cold_5();
  puVar9 = auStackY_890 + 0x20;
  auStackY_890._24_8_ = (uv_close_cb)0x1bd180;
  puStackY_860 = (uv_loop_t *)puVar7;
  init_process_options("spawn_helper4",kill_cb);
  auStackY_890._24_8_ = (uv_close_cb)0x1bd185;
  puVar5 = uv_default_loop();
  auStackY_890._24_8_ = (uv_close_cb)0x1bd19b;
  iVar3 = uv_spawn(puVar5,&process,&options);
  auStackY_890._40_8_ = SEXT48(iVar3);
  auStackY_890._32_8_ = (uv__queue *)0x0;
  if ((uv__queue *)auStackY_890._40_8_ == (uv__queue *)0x0) {
    auStackY_890._24_8_ = (uv_close_cb)0x1bd1be;
    puVar5 = uv_default_loop();
    auStackY_890._24_8_ = (uv_close_cb)0x1bd1cd;
    iVar3 = uv_timer_init(puVar5,&timer);
    auStackY_890._40_8_ = SEXT48(iVar3);
    auStackY_890._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_890._40_8_ != (uv__queue *)0x0) goto LAB_001bd2fa;
    auStackY_890._24_8_ = (uv_close_cb)0x1bd205;
    iVar3 = uv_timer_start(&timer,timer_cb,500,0);
    auStackY_890._40_8_ = SEXT48(iVar3);
    auStackY_890._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_890._40_8_ != (uv__queue *)0x0) goto LAB_001bd307;
    auStackY_890._24_8_ = (uv_close_cb)0x1bd228;
    puVar5 = uv_default_loop();
    auStackY_890._24_8_ = (uv_close_cb)0x1bd232;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    auStackY_890._40_8_ = SEXT48(iVar3);
    auStackY_890._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_890._40_8_ != (uv__queue *)0x0) goto LAB_001bd314;
    auStackY_890._40_8_ = (uv__queue *)0x1;
    auStackY_890._32_8_ = SEXT48(exit_cb_called);
    if ((uv__queue *)auStackY_890._32_8_ != (uv__queue *)0x1) goto LAB_001bd321;
    auStackY_890._40_8_ = (uv__queue *)0x2;
    auStackY_890._32_8_ = SEXT48(close_cb_called);
    if ((uv__queue *)auStackY_890._32_8_ != (uv__queue *)0x2) goto LAB_001bd32e;
    auStackY_890._24_8_ = (uv_close_cb)0x1bd29b;
    puVar7 = (uv_process_options_t *)uv_default_loop();
    auStackY_890._24_8_ = (uv_close_cb)0x1bd2af;
    uv_walk((uv_loop_t *)puVar7,close_walk_cb,(void *)0x0);
    auStackY_890._24_8_ = (uv_close_cb)0x1bd2b9;
    uv_run((uv_loop_t *)puVar7,UV_RUN_DEFAULT);
    auStackY_890._40_8_ = (uv__queue *)0x0;
    auStackY_890._24_8_ = (uv_close_cb)0x1bd2c7;
    puVar5 = uv_default_loop();
    auStackY_890._24_8_ = (uv_close_cb)0x1bd2cf;
    iVar3 = uv_loop_close(puVar5);
    auStackY_890._32_8_ = SEXT48(iVar3);
    if (auStackY_890._40_8_ == auStackY_890._32_8_) {
      auStackY_890._24_8_ = (uv_close_cb)0x1bd2e5;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStackY_890._24_8_ = (uv_close_cb)0x1bd2fa;
    run_test_spawn_and_kill_cold_1();
LAB_001bd2fa:
    auStackY_890._24_8_ = (uv_close_cb)0x1bd307;
    run_test_spawn_and_kill_cold_2();
LAB_001bd307:
    auStackY_890._24_8_ = (uv_close_cb)0x1bd314;
    run_test_spawn_and_kill_cold_3();
LAB_001bd314:
    auStackY_890._24_8_ = (uv_close_cb)0x1bd321;
    run_test_spawn_and_kill_cold_4();
LAB_001bd321:
    auStackY_890._24_8_ = (uv_close_cb)0x1bd32e;
    run_test_spawn_and_kill_cold_5();
LAB_001bd32e:
    auStackY_890._24_8_ = (uv_close_cb)0x1bd33b;
    run_test_spawn_and_kill_cold_6();
  }
  puVar10 = (uv_handle_t *)(auStackY_890 + 0x28);
  auStackY_890._24_8_ = kill_cb;
  run_test_spawn_and_kill_cold_7();
  auStackY_890._24_8_ = (uv_close_cb)0x0;
  auStackY_890._16_8_ = 0;
  auStackY_890._8_8_ = puVar7;
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  auStackY_890._0_8_ = puVar9;
  if (puVar9 == (undefined1 *)0x0) {
    if (extraout_EDX != 0xf) goto LAB_001bd3e9;
    uv_close(puVar10,close_cb);
    auStackY_890._0_8_ = SEXT48(*(int *)&puVar10[1].loop);
    if ((undefined1 *)auStackY_890._0_8_ != (undefined1 *)0x0) {
      iVar3 = uv_kill(*(int *)&puVar10[1].loop,0);
      auStackY_890._0_8_ = SEXT48(iVar3);
      if ((undefined1 *)auStackY_890._0_8_ == (undefined1 *)0xfffffffffffffffd) {
        return iVar3;
      }
      goto LAB_001bd3fb;
    }
  }
  else {
    kill_cb_cold_1();
LAB_001bd3e9:
    kill_cb_cold_2();
  }
  kill_cb_cold_4();
LAB_001bd3fb:
  puVar10 = (uv_handle_t *)auStackY_890;
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close(puVar10,close_cb);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file_swap) {
#ifndef _WIN32
  int r;
  uv_os_fd_t stdout_file;
  uv_os_fd_t stderr_file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");
  unlink("stderr_file");

  init_process_options("spawn_helper6", exit_cb);

  /* open 'stdout_file' and replace STDOUT_FILENO with it */
  r = uv_fs_open(NULL,
                 &fs_req,
                 "stdout_file",
                 O_CREAT | O_RDWR,
                 S_IRUSR | S_IWUSR,
                 NULL);
  ASSERT_OK(r);
  stdout_file = (uv_os_fd_t)fs_req.result;
  uv_fs_req_cleanup(&fs_req);
  stdout_file = dup2(stdout_file, STDOUT_FILENO);
  ASSERT_NE(stdout_file, -1);

  /* open 'stderr_file' and replace STDERR_FILENO with it */
  r = uv_fs_open(NULL, &fs_req, "stderr_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT_OK(r);
  stderr_file = (uv_os_fd_t)fs_req.result;
  uv_fs_req_cleanup(&fs_req);
  stderr_file = dup2(stderr_file, STDERR_FILENO);
  ASSERT_NE(stderr_file, -1);

  /* now we're going to swap them: the child process' stdout will be our
   * stderr_file and vice versa */
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.file = stderr_file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.file = stdout_file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  buf = uv_buf_init(output, sizeof(output));

  /* check the content of stdout_file */
  r = uv_fs_read(NULL, &fs_req, stdout_file, &buf, 1, 0, NULL);
  ASSERT_GE(r, 15);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stdout_file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT_OK(strncmp("hello errworld\n", output, 15));

  /* check the content of stderr_file */
  r = uv_fs_read(NULL, &fs_req, stderr_file, &buf, 1, 0, NULL);
  ASSERT_GE(r, 12);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stderr_file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT_OK(strncmp("hello world\n", output, 12));

  /* Cleanup. */
  unlink("stdout_file");
  unlink("stderr_file");

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#else
  RETURN_SKIP("Unix only test");
#endif
}